

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  size_t sVar1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  Mat int8_weight_data;
  void *ptr;
  Mat int8_weight_data_n;
  Option opt_q;
  void *local_118;
  undefined8 uStack_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  int iStack_100;
  Allocator *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  size_t sStack_e0;
  Mat local_d8;
  Mat local_98;
  Option local_58;
  
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    iVar4 = this->weight_data_size;
    sStack_e0 = (size_t)iVar4;
    local_118 = (void *)0x0;
    uStack_110._0_4_ = 0;
    uStack_110._4_4_ = 0;
    uStack_110 = (int *)0x0;
    uStack_108 = 1;
    uStack_104 = 0;
    iStack_100 = 1;
    local_f8 = (Allocator *)0x0;
    uStack_f0 = CONCAT44(iVar4,1);
    local_e8 = 0x100000001;
    if (iVar4 != 0) {
      uVar7 = sStack_e0 + 3 & 0xfffffffffffffffc;
      local_d8.data = (void *)0x0;
      iVar4 = posix_memalign(&local_d8.data,0x10,uVar7 + 4);
      if (iVar4 != 0) {
        local_d8.data = (void *)0x0;
      }
      local_118 = local_d8.data;
      uStack_110 = (int *)((long)local_d8.data + uVar7);
      *(undefined4 *)((long)local_d8.data + uVar7) = 1;
    }
    if (local_118 == (void *)0x0) {
      bVar9 = true;
    }
    else {
      bVar9 = (long)local_e8._4_4_ * sStack_e0 == 0;
    }
    if (!bVar9) {
      iVar4 = this->weight_data_size / this->num_output;
      if (0 < this->num_output) {
        sVar5 = (size_t)iVar4;
        lVar6 = 0;
        lVar8 = 0;
        do {
          local_58.lightmode = opt->lightmode;
          local_58._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_58.num_threads = opt->num_threads;
          local_58.workspace_allocator = opt->workspace_allocator;
          local_58.use_winograd_convolution = opt->use_winograd_convolution;
          local_58.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_58.use_int8_inference = opt->use_int8_inference;
          local_58.use_vulkan_compute = opt->use_vulkan_compute;
          local_58.use_fp16_packed = opt->use_fp16_packed;
          local_58.use_fp16_storage = opt->use_fp16_storage;
          local_58.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          local_58.use_int8_storage = opt->use_int8_storage;
          local_58.use_int8_arithmetic = opt->use_int8_arithmetic;
          local_58.use_packing_layout = opt->use_packing_layout;
          local_58.use_shader_pack8 = opt->use_shader_pack8;
          local_58.use_bf16_storage = opt->use_bf16_storage;
          local_58._36_4_ = *(undefined4 *)&opt->field_0x24;
          local_58.blob_allocator = local_f8;
          sVar1 = (this->weight_data).elemsize;
          local_d8.data = (void *)(sVar1 * lVar6 + (long)(this->weight_data).data);
          local_d8.elempack = (this->weight_data).elempack;
          local_d8.allocator = (this->weight_data).allocator;
          local_d8.refcount._0_4_ = 0;
          local_d8.refcount._4_4_ = 0;
          local_d8.elemsize._0_4_ = (undefined4)sVar1;
          local_d8.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
          local_d8.w = iVar4;
          local_d8.dims = 1;
          local_d8.h = 1;
          local_d8.c = 1;
          local_98.data = (void *)(CONCAT44(uStack_104,uStack_108) * lVar6 + (long)local_118);
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize._0_4_ = uStack_108;
          local_98.elemsize._4_4_ = uStack_104;
          local_98.elempack = iStack_100;
          local_98.allocator = local_f8;
          local_98.w = iVar4;
          local_98.dims = 1;
          local_98.h = 1;
          local_98.c = 1;
          local_d8.cstep = sVar5;
          local_98.cstep = sVar5;
          quantize_float32_to_int8
                    (&local_d8,&local_98,
                     *(float *)((long)(this->weight_data_int8_scales).data + lVar8 * 4),&local_58);
          piVar2 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                if (local_98.data != (void *)0x0) {
                  free(local_98.data);
                }
              }
              else {
                (**(code **)(*(long *)local_98.allocator + 0x18))();
              }
            }
          }
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.c = 0;
          local_98.cstep = 0;
          piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_d8.allocator == (Allocator *)0x0) {
                if (local_d8.data != (void *)0x0) {
                  free(local_d8.data);
                }
              }
              else {
                (**(code **)(*(long *)local_d8.allocator + 0x18))();
              }
            }
          }
          local_d8.elemsize._0_4_ = 0;
          local_d8.elemsize._4_4_ = 0;
          local_d8.elempack = 0;
          local_d8.data = (void *)0x0;
          local_d8.refcount._0_4_ = 0;
          local_d8.refcount._4_4_ = 0;
          local_d8.dims = 0;
          local_d8.w = 0;
          local_d8.h = 0;
          local_d8.c = 0;
          local_d8.cstep = 0;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + sVar5;
        } while (lVar8 < this->num_output);
      }
      if (&this->weight_data != (Mat *)&local_118) {
        if (uStack_110 != (int *)0x0) {
          LOCK();
          *uStack_110 = *uStack_110 + 1;
          UNLOCK();
        }
        piVar2 = (this->weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            __ptr = (this->weight_data).data;
            pAVar3 = (this->weight_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)(*(long *)pAVar3 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
        (this->weight_data).data = (void *)0x0;
        (this->weight_data).refcount = (int *)0x0;
        (this->weight_data).dims = 0;
        (this->weight_data).w = 0;
        (this->weight_data).h = 0;
        (this->weight_data).c = 0;
        (this->weight_data).cstep = 0;
        (this->weight_data).data = local_118;
        (this->weight_data).refcount = uStack_110;
        (this->weight_data).elemsize = CONCAT44(uStack_104,uStack_108);
        (this->weight_data).elempack = iStack_100;
        (this->weight_data).allocator = local_f8;
        (this->weight_data).dims = (undefined4)uStack_f0;
        (this->weight_data).w = uStack_f0._4_4_;
        (this->weight_data).h = (undefined4)local_e8;
        (this->weight_data).c = local_e8._4_4_;
        (this->weight_data).cstep = sStack_e0;
      }
    }
    if (uStack_110 != (int *)0x0) {
      LOCK();
      *uStack_110 = *uStack_110 + -1;
      UNLOCK();
      if (*uStack_110 == 0) {
        if (local_f8 == (Allocator *)0x0) {
          if (local_118 != (void *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*(long *)local_f8 + 0x18))();
        }
      }
    }
    if (bVar9) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int p=0; p<num_output; p++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * p, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * p, weight_data_size_output);
            quantize_float32_to_int8(weight_data_n, int8_weight_data_n, weight_data_int8_scales[p], opt_q);
        }

        weight_data = int8_weight_data;
    }

    return 0;
}